

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCachePop(Parse *pParse)

{
  int i;
  
  pParse->iCacheLevel = pParse->iCacheLevel + -1;
  if (pParse->nColCache != '\0') {
    i = 0;
    do {
      if (pParse->iCacheLevel < pParse->aColCache[i].iLevel) {
        cacheEntryClear(pParse,i);
      }
      else {
        i = i + 1;
      }
    } while (i < (int)(uint)pParse->nColCache);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCachePop(Parse *pParse){
  int i = 0;
  assert( pParse->iCacheLevel>=1 );
  pParse->iCacheLevel--;
#ifdef SQLITE_DEBUG
  if( pParse->db->flags & SQLITE_VdbeAddopTrace ){
    printf("POP  to %d\n", pParse->iCacheLevel);
  }
#endif
  while( i<pParse->nColCache ){
    if( pParse->aColCache[i].iLevel>pParse->iCacheLevel ){
      cacheEntryClear(pParse, i);
    }else{
      i++;
    }
  }
}